

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_composite(AMQP_VALUE descriptor,uint32_t list_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE_DATA *result;
  uint32_t list_size_local;
  AMQP_VALUE descriptor_local;
  
  l = (LOGGER_LOG)REFCOUNT_AMQP_VALUE_DATA_Create();
  if ((AMQP_VALUE_DATA *)l == (AMQP_VALUE_DATA *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_composite",0x1c3b,1,"Cannot allocate memory for composite type");
    }
  }
  else {
    ((AMQP_VALUE_DATA *)l)->type = AMQP_TYPE_COMPOSITE;
    pAVar3 = amqpvalue_clone(descriptor);
    (((AMQP_VALUE_DATA *)l)->value).described_value.descriptor = pAVar3;
    if ((((AMQP_VALUE_DATA *)l)->value).described_value.descriptor == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_create_composite",0x1c43,1,
                  "Cannot clone descriptor for composite type");
      }
      REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      pAVar3 = amqpvalue_create_list();
      (((AMQP_VALUE_DATA *)l)->value).described_value.value = pAVar3;
      if ((((AMQP_VALUE_DATA *)l)->value).described_value.value == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                    ,"amqpvalue_create_composite",0x1c4c,1,"Cannot create list for composite type");
        }
        amqpvalue_destroy((((AMQP_VALUE_DATA *)l)->value).described_value.descriptor);
        REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        iVar1 = amqpvalue_set_list_item_count
                          ((((AMQP_VALUE_DATA *)l)->value).described_value.value,list_size);
        if (iVar1 != 0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                      ,"amqpvalue_create_composite",0x1c55,1,
                      "Cannot set list item count for composite type");
          }
          amqpvalue_destroy((((AMQP_VALUE_DATA *)l)->value).described_value.descriptor);
          amqpvalue_destroy((((AMQP_VALUE_DATA *)l)->value).described_value.value);
          REFCOUNT_AMQP_VALUE_DATA_Destroy((AMQP_VALUE_DATA *)l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (AMQP_VALUE)l;
}

Assistant:

AMQP_VALUE amqpvalue_create_composite(AMQP_VALUE descriptor, uint32_t list_size)
{
    AMQP_VALUE_DATA* result = (AMQP_VALUE_DATA*)REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        LogError("Cannot allocate memory for composite type");
    }
    else
    {
        result->type = AMQP_TYPE_COMPOSITE;
        result->value.described_value.descriptor = amqpvalue_clone(descriptor);
        if (result->value.described_value.descriptor == NULL)
        {
            LogError("Cannot clone descriptor for composite type");
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
            result = NULL;
        }
        else
        {
            result->value.described_value.value = amqpvalue_create_list();
            if (result->value.described_value.value == NULL)
            {
                LogError("Cannot create list for composite type");
                amqpvalue_destroy(result->value.described_value.descriptor);
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (amqpvalue_set_list_item_count(result->value.described_value.value, list_size) != 0)
                {
                    LogError("Cannot set list item count for composite type");
                    amqpvalue_destroy(result->value.described_value.descriptor);
                    amqpvalue_destroy(result->value.described_value.value);
                    REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}